

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O1

void __thiscall
Assimp::SplitByBoneCountProcess::UpdateNode(SplitByBoneCountProcess *this,aiNode *pNode)

{
  pointer pvVar1;
  void *__src;
  void *pvVar2;
  uint *__dest;
  ulong uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newMeshList;
  void *local_48;
  void *pvStack_40;
  long local_38;
  
  if (pNode->mNumMeshes != 0) {
    local_48 = (void *)0x0;
    pvStack_40 = (void *)0x0;
    local_38 = 0;
    if (pNode->mNumMeshes != 0) {
      uVar3 = 0;
      do {
        pvVar1 = (this->mSubMeshIndices).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,pvStack_40,
                   pvVar1[pNode->mMeshes[uVar3]].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pvVar1[pNode->mMeshes[uVar3]].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8));
        uVar3 = uVar3 + 1;
      } while (uVar3 < pNode->mNumMeshes);
    }
    if (pNode->mMeshes != (uint *)0x0) {
      operator_delete__(pNode->mMeshes);
    }
    pvVar2 = pvStack_40;
    __src = local_48;
    uVar3 = (long)pvStack_40 - (long)local_48;
    pNode->mNumMeshes = (uint)(uVar3 >> 2);
    __dest = (uint *)operator_new__(uVar3 & 0x3fffffffc);
    pNode->mMeshes = __dest;
    if (pvVar2 != __src) {
      memmove(__dest,__src,uVar3);
    }
    if (__src != (void *)0x0) {
      operator_delete(__src,local_38 - (long)__src);
    }
  }
  if (pNode->mNumChildren != 0) {
    uVar3 = 0;
    do {
      UpdateNode(this,pNode->mChildren[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < pNode->mNumChildren);
  }
  return;
}

Assistant:

void SplitByBoneCountProcess::UpdateNode( aiNode* pNode) const
{
    // rebuild the node's mesh index list
    if( pNode->mNumMeshes > 0 )
    {
        std::vector<unsigned int> newMeshList;
        for( unsigned int a = 0; a < pNode->mNumMeshes; ++a)
        {
            unsigned int srcIndex = pNode->mMeshes[a];
            const std::vector<unsigned int>& replaceMeshes = mSubMeshIndices[srcIndex];
            newMeshList.insert( newMeshList.end(), replaceMeshes.begin(), replaceMeshes.end());
        }

        delete [] pNode->mMeshes;
        pNode->mNumMeshes = static_cast<unsigned int>(newMeshList.size());
        pNode->mMeshes = new unsigned int[pNode->mNumMeshes];
        std::copy( newMeshList.begin(), newMeshList.end(), pNode->mMeshes);
    }

    // do that also recursively for all children
    for( unsigned int a = 0; a < pNode->mNumChildren; ++a )
    {
        UpdateNode( pNode->mChildren[a]);
    }
}